

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O1

void __thiscall ProjectWriter::writeOptions(ProjectWriter *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_48;
  
  puVar1 = &this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n[OPTIONS]\n",0xb);
  Options::hydOptionsToStr_abi_cxx11_(&local_48,&this->network->options);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  paVar2 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n",1);
  Options::demandOptionsToStr_abi_cxx11_(&local_48,&this->network->options);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n",1);
  Options::qualOptionsToStr_abi_cxx11_(&local_48,&this->network->options);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ProjectWriter::writeOptions()
{
    fout << "\n[OPTIONS]\n";
    fout << network->options.hydOptionsToStr();
    fout << "\n";
    fout << network->options.demandOptionsToStr();
    fout << "\n";
    fout << network->options.qualOptionsToStr();
}